

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O1

void __thiscall QAction::setActionGroup(QAction *this,QActionGroup *group)

{
  QActionPrivate *this_00;
  Data *pDVar1;
  Data *pDVar2;
  QObject *pQVar3;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  pDVar2 = (this_00->group).wp.d;
  if ((pDVar2 == (Data *)0x0) || ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0))
  {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this_00->group).wp.value;
  }
  if (pQVar3 != &group->super_QObject) {
    if (((pDVar2 != (Data *)0x0) &&
        ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i != 0)) &&
       ((this_00->group).wp.value != (QObject *)0x0)) {
      QActionGroup::removeAction((QActionGroup *)(this_00->group).wp.value,this);
    }
    if (group == (QActionGroup *)0x0) {
      pDVar2 = (Data *)0x0;
    }
    else {
      pDVar2 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&group->super_QObject);
    }
    pDVar1 = (this_00->group).wp.d;
    (this_00->group).wp.d = pDVar2;
    (this_00->group).wp.value = &group->super_QObject;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar1);
      }
    }
    if (group != (QActionGroup *)0x0) {
      QActionGroup::addAction(group,this);
    }
    QActionPrivate::sendDataChanged(this_00);
    return;
  }
  return;
}

Assistant:

void QAction::setActionGroup(QActionGroup *group)
{
    Q_D(QAction);
    if (group == d->group)
        return;

    if (d->group)
        d->group->removeAction(this);
    d->group = group;
    if (group)
        group->addAction(this);
    d->sendDataChanged();
}